

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_70 [8];
  mbedtls_mpi T;
  mbedtls_mpi_uint d;
  int sign;
  size_t n;
  size_t slen;
  size_t j;
  size_t i;
  char *pcStack_28;
  int ret;
  char *s_local;
  int radix_local;
  mbedtls_mpi *X_local;
  
  d._4_4_ = 1;
  if ((radix < 2) || (0x10 < radix)) {
    return -4;
  }
  mbedtls_mpi_init((mbedtls_mpi *)local_70);
  if (*s == '\0') {
    mbedtls_mpi_free(X);
    return 0;
  }
  pcStack_28 = s;
  if (*s == '-') {
    pcStack_28 = s + 1;
    d._4_4_ = -1;
  }
  sVar1 = strlen(pcStack_28);
  if (radix == 0x10) {
    if (0x3fffffffffffffff < sVar1) {
      return -4;
    }
    i._4_4_ = mbedtls_mpi_grow(X,((sVar1 << 2) >> 6) + (long)(int)(uint)((sVar1 & 0xf) != 0));
    if ((i._4_4_ != 0) || (i._4_4_ = mbedtls_mpi_lset(X,0), i._4_4_ != 0)) goto LAB_0028e328;
    slen = 0;
    for (j = sVar1; j != 0; j = j - 1) {
      i._4_4_ = mpi_get_digit((mbedtls_mpi_uint *)&T.s,0x10,pcStack_28[j - 1]);
      if (i._4_4_ != 0) goto LAB_0028e328;
      X->p[slen >> 4] = T._8_8_ << (sbyte)((slen & 0xf) << 2) | X->p[slen >> 4];
      slen = slen + 1;
    }
  }
  else {
    i._4_4_ = mbedtls_mpi_lset(X,0);
    if (i._4_4_ != 0) goto LAB_0028e328;
    for (j = 0; j < sVar1; j = j + 1) {
      i._4_4_ = mpi_get_digit((mbedtls_mpi_uint *)&T.s,radix,pcStack_28[j]);
      if (((i._4_4_ != 0) ||
          (i._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)local_70,X,(long)radix), i._4_4_ != 0)) ||
         (i._4_4_ = mbedtls_mpi_add_int(X,(mbedtls_mpi *)local_70,T._8_8_), i._4_4_ != 0))
      goto LAB_0028e328;
    }
  }
  if ((d._4_4_ < 0) && (sVar2 = mbedtls_mpi_bitlen(X), sVar2 != 0)) {
    X->s = -1;
  }
LAB_0028e328:
  mbedtls_mpi_free((mbedtls_mpi *)local_70);
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(s != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}